

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QAbstractItemView * __thiscall QFileDialogPrivate::currentView(QFileDialogPrivate *this)

{
  Ui_QFileDialog *pUVar1;
  QWidget *pQVar2;
  QWidget *pQVar3;
  long in_RDI;
  QFileDialogListView *local_8;
  
  pUVar1 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                     ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                      (in_RDI + 0x370));
  if (pUVar1->stackedWidget == (QStackedWidget *)0x0) {
    local_8 = (QFileDialogListView *)0x0;
  }
  else {
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
               (in_RDI + 0x370));
    pQVar2 = QStackedWidget::currentWidget((QStackedWidget *)0x759062);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
               (in_RDI + 0x370));
    pQVar3 = (QWidget *)QObject::parent((QObject *)0x759084);
    if (pQVar2 == pQVar3) {
      pUVar1 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                         ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                          (in_RDI + 0x370));
      local_8 = pUVar1->listView;
    }
    else {
      pUVar1 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                         ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                          (in_RDI + 0x370));
      local_8 = (QFileDialogListView *)pUVar1->treeView;
    }
  }
  return (QAbstractItemView *)local_8;
}

Assistant:

QAbstractItemView *QFileDialogPrivate::currentView() const {
    if (!qFileDialogUi->stackedWidget)
        return nullptr;
    if (qFileDialogUi->stackedWidget->currentWidget() == qFileDialogUi->listView->parent())
        return qFileDialogUi->listView;
    return qFileDialogUi->treeView;
}